

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O1

void EthBasePort::PrintDebugDataKSZ(ostream *debugStream,quadlet_t *data,double clockPeriod)

{
  bool bVar1;
  ostream *poVar2;
  double dVar3;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"PrintDebugDataKSZ","");
  bVar1 = CheckDebugHeader(debugStream,&local_48,(char *)data,2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"*** KSZ: ",9);
    if (*(short *)((long)data + 6) < 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"isDMAWrite ",0xb);
    }
    if ((*(byte *)((long)data + 7) & 0x40) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"sendRequest ",0xc);
    }
    if ((*(byte *)((long)data + 7) & 0x20) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"IRQ ",4);
    }
    if ((*(byte *)((long)data + 7) & 0x10) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"isInIRQ ",8);
    }
    if ((*(byte *)((long)data + 7) & 8) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"link-on ",8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)debugStream + -0x18) + (char)debugStream);
    std::ostream::put((char)debugStream);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"State: ",7);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", nextState: ",0xd);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", retState: ",0xc);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", PC: ",6);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"RegISROther: ",0xd);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"FrameCount: ",0xc);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"numReset: ",10);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"numPacketValid: ",0x10);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"numPacketInvalid: ",0x12);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"numPacketSent: ",0xf);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"rxPktWords: ",0xc);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"txPktWords: ",0xc);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"respBytes: ",0xb);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    dVar3 = clockPeriod * 1000000.0;
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"timeReceive (us): ",0x12);
    poVar2 = std::ostream::_M_insert<double>((double)(ushort)data[6] * dVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"timeSend (us): ",0xf);
    poVar2 = std::ostream::_M_insert<double>((double)*(ushort *)((long)data + 0x1a) * dVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"bw_wait: ",9);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
    poVar2 = std::ostream::_M_insert<double>((double)*(ushort *)((long)data + 0x12) * dVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," us)",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  return;
}

Assistant:

void EthBasePort::PrintDebugDataKSZ(std::ostream &debugStream, const quadlet_t *data, double clockPeriod)
{
    // Following structure must match DebugData in KSZ8851.v
    struct DebugData {
        char     header[4];        // Quad 0
        uint16_t quad1_low;        // Quad 1
        uint16_t statusbits;
        uint8_t  runPC;            // Quad 2
        uint8_t  nextState;
        uint8_t  retState;
        uint8_t  state;
        uint16_t regISROther;      // Quad 3
        uint16_t respBytes;
        uint8_t  numPacketSent;    // Quad 4
        uint8_t  frameCount;
        uint16_t bw_wait;
        uint16_t rxPktWords;      // Quad 5
        uint16_t txPktWords;
        uint16_t timeReceive;     // Quad 6
        uint16_t timeSend;
        uint16_t numPacketValid;  // Quad 7
        uint8_t  numPacketInvalid;
        uint8_t  numReset;
        uint32_t unused[8];       // Unused (except if DEBOUNCE_STATES)
    };
    if (sizeof(DebugData) != 16*sizeof(quadlet_t)) {
        debugStream << "PrintDebugDataKSZ: structure packing problem" << std::endl;
        return;
    }
    const DebugData *p = reinterpret_cast<const DebugData *>(data);
    if (!CheckDebugHeader(debugStream, "PrintDebugDataKSZ", p->header, 2))
        return;

    debugStream << "*** KSZ: ";
    if (p->statusbits & 0x8000) debugStream << "isDMAWrite ";
    if (p->statusbits & 0x4000) debugStream << "sendRequest ";
    if (p->statusbits & 0x2000) debugStream << "IRQ ";
    if (p->statusbits & 0x1000) debugStream << "isInIRQ ";
    if (p->statusbits & 0x0800) debugStream << "link-on ";
    debugStream << std::endl;
    debugStream << "State: " << static_cast<uint16_t>(p->state)
                << ", nextState: " << static_cast<uint16_t>(p->nextState)
                << ", retState: " << static_cast<uint16_t> (p->retState)
                << ", PC: " << static_cast<uint16_t>(p->runPC) << std::endl;
    debugStream << "RegISROther: " << std::hex << p->regISROther << std::endl;
    debugStream << "FrameCount: " << std::dec << static_cast<uint16_t>(p->frameCount) << std::endl;
    debugStream << "numReset: " << std::dec << static_cast<uint16_t>(p->numReset) << std::endl;
    debugStream << "numPacketValid: " << std::dec << p->numPacketValid << std::endl;
    debugStream << "numPacketInvalid: " << std::dec << static_cast<uint16_t>(p->numPacketInvalid) << std::endl;
    debugStream << "numPacketSent: " << std::dec << static_cast<uint16_t>(p->numPacketSent) << std::endl;
    debugStream << "rxPktWords: " << std::dec << p->rxPktWords << std::endl;
    debugStream << "txPktWords: " << std::dec << p->txPktWords << std::endl;
    debugStream << "respBytes: " << p->respBytes << std::endl;
    const double bits2uS = clockPeriod*1e6;
    debugStream << "timeReceive (us): " << p->timeReceive*bits2uS << std::endl;
    debugStream << "timeSend (us): " << p->timeSend*bits2uS << std::endl;
    debugStream << "bw_wait: " << std::dec << p->bw_wait << " (" << p->bw_wait*bits2uS << " us)" << std::endl;
}